

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arch_memory_mapping.c
# Opt level: O0

void x86_cpu_get_memory_mapping_x86_64(CPUState *cs,MemoryMappingList *list)

{
  _Bool _Var1;
  int32_t a20_mask_00;
  _Bool pse;
  hwaddr pde_addr;
  hwaddr pdpe_addr;
  hwaddr pml4e_addr;
  hwaddr pml5e_addr;
  int32_t a20_mask;
  CPUX86State *env;
  X86CPU *cpu;
  MemoryMappingList *list_local;
  CPUState *cs_local;
  
  _Var1 = cpu_paging_enabled(cs);
  if (_Var1) {
    a20_mask_00 = x86_get_a20_mask((CPUX86State *)(cs[1].tb_jmp_cache + 0xeb));
    if (((ulong)cs[1].tb_jmp_cache[0x124] & 0x20) == 0) {
      walk_pde2(list,cs->as,
                (ulong)cs[1].tb_jmp_cache[0x123] & 0xfffffffffffff000 & (long)a20_mask_00,
                a20_mask_00,((ulong)cs[1].tb_jmp_cache[0x124] & 0x10) != 0);
    }
    else if (((ulong)cs[1].tb_jmp_cache[0x101] & 0x4000) == 0) {
      walk_pdpe2(list,cs->as,
                 (ulong)cs[1].tb_jmp_cache[0x123] & 0xffffffffffffffe0 & (long)a20_mask_00,
                 a20_mask_00);
    }
    else if (((ulong)cs[1].tb_jmp_cache[0x124] & 0x1000) == 0) {
      walk_pml4e(list,cs->as,(ulong)cs[1].tb_jmp_cache[0x123] & 0xffffffffff000 & (long)a20_mask_00,
                 a20_mask_00,0xffff000000000000);
    }
    else {
      walk_pml5e(list,cs->as,(ulong)cs[1].tb_jmp_cache[0x123] & 0xffffffffff000 & (long)a20_mask_00,
                 a20_mask_00);
    }
  }
  return;
}

Assistant:

void x86_cpu_get_memory_mapping(CPUState *cs, MemoryMappingList *list)
{
    X86CPU *cpu = X86_CPU(cs);
    CPUX86State *env = &cpu->env;
    int32_t a20_mask;

    if (!cpu_paging_enabled(cs)) {
        /* paging is disabled */
        return;
    }

    a20_mask = x86_get_a20_mask(env);
    if (env->cr[4] & CR4_PAE_MASK) {
#ifdef TARGET_X86_64
        if (env->hflags & HF_LMA_MASK) {
            if (env->cr[4] & CR4_LA57_MASK) {
                hwaddr pml5e_addr;

                pml5e_addr = (env->cr[3] & PLM4_ADDR_MASK) & a20_mask;
                walk_pml5e(list, cs->as, pml5e_addr, a20_mask);
            } else {
                hwaddr pml4e_addr;

                pml4e_addr = (env->cr[3] & PLM4_ADDR_MASK) & a20_mask;
                walk_pml4e(list, cs->as, pml4e_addr, a20_mask,
                        0xffffULL << 48);
            }
        } else
#endif
        {
            hwaddr pdpe_addr;

            pdpe_addr = (env->cr[3] & ~0x1f) & a20_mask;
            walk_pdpe2(list, cs->as, pdpe_addr, a20_mask);
        }
    } else {
        hwaddr pde_addr;
        bool pse;

        pde_addr = (env->cr[3] & ~0xfff) & a20_mask;
        pse = !!(env->cr[4] & CR4_PSE_MASK);
        walk_pde2(list, cs->as, pde_addr, a20_mask, pse);
    }
}